

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O0

void scale_patch_(double *alpha,Integer *ndim,double *patch1,Integer *LO1,Integer *HI1,
                 Integer *DIMS1)

{
  Integer *in_RCX;
  undefined8 *in_RSI;
  Integer *in_R8;
  Integer *in_R9;
  int dims1 [7];
  int lo1 [7];
  int hi1 [7];
  int aiStackY_98 [8];
  int local_78 [8];
  int *in_stack_ffffffffffffffa8;
  int *in_stack_ffffffffffffffb0;
  int *in_stack_ffffffffffffffb8;
  double *in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffcc;
  
  if ((int)*in_RSI < 8) {
    f2c_adj_indices(in_R8,(int *)&stack0xffffffffffffffa8,(int)*in_RSI);
    f2c_adj_indices(in_RCX,local_78,(int)*in_RSI);
    f2c_copy_indices(in_R9,aiStackY_98,(int)*in_RSI);
    scale_patch_internal
              ((double)in_R9,in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc0,
               in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    return;
  }
  __assert_fail("(int)*ndim <= GA_MAX_DIM",
                "/workspace/llm4binary/github/license_c_cmakelists/GlobalArrays[P]ga/global/testing/util.c"
                ,0x155,
                "void scale_patch_(double *, Integer *, double *, Integer *, Integer *, Integer *)")
  ;
}

Assistant:

void FATR scale_patch_(double *alpha, Integer *ndim, double *patch1, 
                 Integer LO1[], Integer HI1[], Integer DIMS1[])
{
int hi1[GA_MAX_DIM], lo1[GA_MAX_DIM], dims1[GA_MAX_DIM];

    assert((int)*ndim <= GA_MAX_DIM);
    f2c_adj_indices(HI1, hi1, (int)*ndim);
    f2c_adj_indices(LO1, lo1, (int)*ndim);
    f2c_copy_indices(DIMS1, dims1, (int)*ndim);
    scale_patch_internal(*alpha, (int)*ndim, patch1, lo1, hi1, dims1);
}